

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
mjs::array_literal_expression::array_literal_expression
          (array_literal_expression *this,source_extend *extend,
          vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
          *elements)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001db120;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar2 = extend->end;
  (this->super_expression).super_syntax_node.extend_.start = extend->start;
  (this->super_expression).super_syntax_node.extend_.end = uVar2;
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__array_literal_expression_001db3a8;
  (this->elements_).
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (elements->
       super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->elements_).
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (elements->
       super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->elements_).
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (elements->
       super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (elements->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (elements->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (elements->
  super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

syntax_node(const source_extend& extend) : extend_(extend) {
    }